

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSelect(TypeChecker *this,Type expected)

{
  bool bVar1;
  Enum EVar2;
  Result RVar3;
  Result local_38;
  Enum local_34;
  Enum local_30;
  Type local_2c;
  Enum local_28;
  Type local_24;
  Type local_20;
  Type result_type;
  Type type2;
  Type type1;
  TypeChecker *this_local;
  Type expected_local;
  Result result;
  
  this_local._0_4_ = expected.enum_;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  Type::Type(&result_type,Any);
  Type::Type(&local_20,Any);
  Type::Type(&local_24,Any);
  Type::Type(&local_2c,I32);
  local_28 = (Enum)PeekAndCheckType(this,0,local_2c);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_28);
  local_30 = (Enum)PeekType(this,1,&result_type);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  local_34 = (Enum)PeekType(this,2,&local_20);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
  EVar2 = Type::operator_cast_to_Enum((Type *)&this_local);
  if (EVar2 == Any) {
    bVar1 = Type::IsRef(&result_type);
    if ((bVar1) || (bVar1 = Type::IsRef(&local_20), bVar1)) {
      Result::Result(&local_38,Error);
      this_local._4_4_ = local_38.enum_;
    }
    else {
      RVar3 = CheckType(result_type,local_20);
      Result::operator|=((Result *)((long)&this_local + 4),RVar3);
      local_24.enum_ = result_type.enum_;
    }
  }
  else {
    RVar3 = CheckType(result_type,this_local._0_4_);
    Result::operator|=((Result *)((long)&this_local + 4),RVar3);
    RVar3 = CheckType(local_20,this_local._0_4_);
    Result::operator|=((Result *)((long)&this_local + 4),RVar3);
  }
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type::Enum>
            (this,this_local._4_4_,"select",local_24,local_24,I32);
  RVar3 = DropTypes(this,3);
  Result::operator|=((Result *)((long)&this_local + 4),RVar3);
  PushType(this,local_24);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnSelect(Type expected) {
  Result result = Result::Ok;
  Type type1 = Type::Any;
  Type type2 = Type::Any;
  Type result_type = Type::Any;
  result |= PeekAndCheckType(0, Type::I32);
  result |= PeekType(1, &type1);
  result |= PeekType(2, &type2);
  if (expected == Type::Any) {
    if (type1.IsRef() || type2.IsRef()) {
      result = Result::Error;
    } else {
      result |= CheckType(type1, type2);
      result_type = type1;
    }
  } else {
    result |= CheckType(type1, expected);
    result |= CheckType(type2, expected);
  }
  PrintStackIfFailed(result, "select", result_type, result_type, Type::I32);
  result |= DropTypes(3);
  PushType(result_type);
  return result;
}